

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O2

GCcdata * lj_cdata_newv(lua_State *L,CTypeID id,CTSize sz,CTSize align)

{
  GCcdata *pGVar1;
  uint64_t uVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  iVar4 = 1 << ((byte)align & 0x1f);
  iVar6 = 0x18;
  if (3 < align) {
    iVar6 = iVar4 + 0x10;
  }
  pvVar3 = lj_mem_realloc(L,(void *)0x0,0,(ulong)(sz + iVar6));
  uVar5 = (ulong)(iVar4 - 1);
  uVar5 = ~uVar5 & (long)pvVar3 + uVar5 + 0x18;
  pGVar1 = (GCcdata *)(uVar5 - 0x10);
  *(short *)(uVar5 - 0x18) = (short)pGVar1 - (short)pvVar3;
  *(short *)(uVar5 - 0x16) = (short)iVar6;
  *(CTSize *)(uVar5 - 0x14) = sz;
  uVar2 = (L->glref).ptr64;
  *(undefined8 *)(uVar5 - 0x10) = *(undefined8 *)(uVar2 + 0x28);
  *(GCcdata **)(uVar2 + 0x28) = pGVar1;
  *(byte *)(uVar5 - 8) = *(byte *)(uVar2 + 0x20) & 3 | 0x80;
  *(undefined1 *)(uVar5 - 7) = 10;
  *(short *)(uVar5 - 6) = (short)id;
  return pGVar1;
}

Assistant:

GCcdata *lj_cdata_newv(lua_State *L, CTypeID id, CTSize sz, CTSize align)
{
  global_State *g;
  MSize extra = sizeof(GCcdataVar) + sizeof(GCcdata) +
		(align > CT_MEMALIGN ? (1u<<align) - (1u<<CT_MEMALIGN) : 0);
  char *p = lj_mem_newt(L, extra + sz, char);
  uintptr_t adata = (uintptr_t)p + sizeof(GCcdataVar) + sizeof(GCcdata);
  uintptr_t almask = (1u << align) - 1u;
  GCcdata *cd = (GCcdata *)(((adata + almask) & ~almask) - sizeof(GCcdata));
  lj_assertL((char *)cd - p < 65536, "excessive cdata alignment");
  cdatav(cd)->offset = (uint16_t)((char *)cd - p);
  cdatav(cd)->extra = extra;
  cdatav(cd)->len = sz;
  g = G(L);
  setgcrefr(cd->nextgc, g->gc.root);
  setgcref(g->gc.root, obj2gco(cd));
  newwhite(g, obj2gco(cd));
  cd->marked |= 0x80;
  cd->gct = ~LJ_TCDATA;
  cd->ctypeid = id;
  return cd;
}